

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O2

void __thiscall
libtorrent::posix_disk_io::async_move_storage
          (posix_disk_io *this,storage_index_t storage,string *p,move_flags_t flags,
          function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
          *handler)

{
  io_context *ctx;
  _Manager_type p_Var1;
  status_t ret;
  storage_error ec;
  char local_b1;
  storage_error local_b0;
  undefined1 local_98 [16];
  _Manager_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70 [32];
  error_code local_50;
  undefined3 local_40;
  operation_t oStack_3d;
  string *local_38;
  char *local_30;
  
  local_b0.ec.val_ = 0;
  local_b0.ec._4_4_ = local_b0.ec._4_4_ & 0xffffff00;
  local_b0.ec.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_b0._16_3_ = 0xffffff;
  local_b0.operation = unknown;
  local_b1 = '\0';
  aux::posix_storage::move_storage
            ((pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98,
             (posix_storage *)
             (this->m_torrents).
             super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
             .
             super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[storage.m_val]._M_t.
             super___uniq_ptr_impl<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>
             ,p,flags,&local_b0);
  local_38 = p;
  local_30 = &local_b1;
  ::std::
  tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
  ::operator=((tuple<libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>&,std::__cxx11::string&>
               *)&local_38,
              (pair<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_98);
  ::std::__cxx11::string::~string((string *)(local_98 + 8));
  ctx = this->m_ios;
  local_98._0_8_ = (void *)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_88 = (_Manager_type)0x0;
  local_80._M_allocated_capacity = (size_type)handler->_M_invoker;
  p_Var1 = (handler->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_98._0_8_ = *(undefined8 *)&(handler->super__Function_base)._M_functor;
    local_98._8_8_ = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_88 = p_Var1;
  }
  local_80._M_local_buf[8] = local_b1;
  ::std::__cxx11::string::string(local_70,(string *)p);
  local_40 = local_b0._16_3_;
  oStack_3d = local_b0.operation;
  local_50.failed_ = local_b0.ec.failed_;
  local_50._5_3_ = local_b0.ec._5_3_;
  local_50.val_ = local_b0.ec.val_;
  local_50.cat_ = local_b0.ec.cat_;
  boost::asio::
  post<boost::asio::io_context,libtorrent::posix_disk_io::async_move_storage(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string,libtorrent::move_flags_t,std::function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>)::_lambda()_1_>
            (ctx,(type *)local_98,(type *)0x0);
  async_move_storage(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string,libtorrent::move_flags_t,std::function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>)
  ::{lambda()#1}::~function((_lambda___1_ *)local_98);
  return;
}

Assistant:

void async_move_storage(storage_index_t const storage, std::string p
			, move_flags_t const flags
			, std::function<void(status_t, std::string const&, storage_error const&)> handler) override
		{
			posix_storage* st = m_torrents[storage].get();
			storage_error ec;
			status_t ret;
			std::tie(ret, p) = st->move_storage(p, flags, ec);
			post(m_ios, [=, h = std::move(handler)]{ h(ret, p, ec); });
		}